

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall tinyxml2::XMLDocument::Identify(XMLDocument *this,char *p,XMLNode **node)

{
  bool bVar1;
  undefined8 *in_RDX;
  char *in_RSI;
  long in_RDI;
  XMLText *text;
  XMLNode *returnNode;
  char *start;
  XMLDocument *in_stack_ffffffffffffff88;
  XMLElement *in_stack_ffffffffffffff90;
  MemPoolT<104> *in_stack_ffffffffffffffb0;
  XMLText *local_30;
  char *local_18;
  char *local_8;
  
  local_8 = XMLUtil::SkipWhiteSpace((char *)0x2a1d81);
  if (*local_8 == '\0') {
    *in_RDX = 0;
  }
  else {
    bVar1 = XMLUtil::StringEqual(local_8,Identify::xmlHeader,2);
    if (bVar1) {
      local_30 = (XMLText *)MemPoolT<88>::Alloc((MemPoolT<88> *)in_stack_ffffffffffffffb0);
      XMLDeclaration::XMLDeclaration
                ((XMLDeclaration *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      (local_30->super_XMLNode)._memPool = (MemPool *)(in_RDI + 0x200);
      local_18 = local_8 + 2;
    }
    else {
      bVar1 = XMLUtil::StringEqual(local_8,Identify::commentHeader,4);
      if (bVar1) {
        local_30 = (XMLText *)MemPoolT<88>::Alloc((MemPoolT<88> *)in_stack_ffffffffffffffb0);
        XMLComment::XMLComment((XMLComment *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        (local_30->super_XMLNode)._memPool = (MemPool *)(in_RDI + 0x200);
        local_18 = local_8 + 4;
      }
      else {
        bVar1 = XMLUtil::StringEqual(local_8,Identify::cdataHeader,9);
        if (bVar1) {
          local_30 = (XMLText *)MemPoolT<96>::Alloc((MemPoolT<96> *)in_stack_ffffffffffffffb0);
          XMLText::XMLText((XMLText *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          (local_30->super_XMLNode)._memPool = (MemPool *)(in_RDI + 0x180);
          local_18 = local_8 + 9;
          XMLText::SetCData(local_30,true);
        }
        else {
          bVar1 = XMLUtil::StringEqual(local_8,Identify::dtdHeader,2);
          if (bVar1) {
            local_30 = (XMLText *)MemPoolT<88>::Alloc((MemPoolT<88> *)in_stack_ffffffffffffffb0);
            XMLUnknown::XMLUnknown
                      ((XMLUnknown *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
            (local_30->super_XMLNode)._memPool = (MemPool *)(in_RDI + 0x200);
            local_18 = local_8 + 2;
          }
          else {
            bVar1 = XMLUtil::StringEqual(local_8,Identify::elementHeader,1);
            if (bVar1) {
              local_30 = (XMLText *)MemPoolT<104>::Alloc(in_stack_ffffffffffffffb0);
              XMLElement::XMLElement(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
              (local_30->super_XMLNode)._memPool = (MemPool *)(in_RDI + 0x80);
              local_18 = local_8 + 1;
            }
            else {
              local_30 = (XMLText *)MemPoolT<96>::Alloc((MemPoolT<96> *)in_stack_ffffffffffffffb0);
              XMLText::XMLText(local_30,in_stack_ffffffffffffff88);
              (local_30->super_XMLNode)._memPool = (MemPool *)(in_RDI + 0x180);
              local_18 = in_RSI;
            }
          }
        }
      }
    }
    *in_RDX = local_30;
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

char* XMLDocument::Identify( char* p, XMLNode** node )
{
    TIXMLASSERT( node );
    TIXMLASSERT( p );
    char* const start = p;
    p = XMLUtil::SkipWhiteSpace( p );
    if( !*p ) {
        *node = 0;
        TIXMLASSERT( p );
        return p;
    }

    // These strings define the matching patterns:
    static const char* xmlHeader		= { "<?" };
    static const char* commentHeader	= { "<!--" };
    static const char* cdataHeader		= { "<![CDATA[" };
    static const char* dtdHeader		= { "<!" };
    static const char* elementHeader	= { "<" };	// and a header for everything else; check last.

    static const int xmlHeaderLen		= 2;
    static const int commentHeaderLen	= 4;
    static const int cdataHeaderLen		= 9;
    static const int dtdHeaderLen		= 2;
    static const int elementHeaderLen	= 1;

    TIXMLASSERT( sizeof( XMLComment ) == sizeof( XMLUnknown ) );		// use same memory pool
    TIXMLASSERT( sizeof( XMLComment ) == sizeof( XMLDeclaration ) );	// use same memory pool
    XMLNode* returnNode = 0;
    if ( XMLUtil::StringEqual( p, xmlHeader, xmlHeaderLen ) ) {
        TIXMLASSERT( sizeof( XMLDeclaration ) == _commentPool.ItemSize() );
        returnNode = new (_commentPool.Alloc()) XMLDeclaration( this );
        returnNode->_memPool = &_commentPool;
        p += xmlHeaderLen;
    }
    else if ( XMLUtil::StringEqual( p, commentHeader, commentHeaderLen ) ) {
        TIXMLASSERT( sizeof( XMLComment ) == _commentPool.ItemSize() );
        returnNode = new (_commentPool.Alloc()) XMLComment( this );
        returnNode->_memPool = &_commentPool;
        p += commentHeaderLen;
    }
    else if ( XMLUtil::StringEqual( p, cdataHeader, cdataHeaderLen ) ) {
        TIXMLASSERT( sizeof( XMLText ) == _textPool.ItemSize() );
        XMLText* text = new (_textPool.Alloc()) XMLText( this );
        returnNode = text;
        returnNode->_memPool = &_textPool;
        p += cdataHeaderLen;
        text->SetCData( true );
    }
    else if ( XMLUtil::StringEqual( p, dtdHeader, dtdHeaderLen ) ) {
        TIXMLASSERT( sizeof( XMLUnknown ) == _commentPool.ItemSize() );
        returnNode = new (_commentPool.Alloc()) XMLUnknown( this );
        returnNode->_memPool = &_commentPool;
        p += dtdHeaderLen;
    }
    else if ( XMLUtil::StringEqual( p, elementHeader, elementHeaderLen ) ) {
        TIXMLASSERT( sizeof( XMLElement ) == _elementPool.ItemSize() );
        returnNode = new (_elementPool.Alloc()) XMLElement( this );
        returnNode->_memPool = &_elementPool;
        p += elementHeaderLen;
    }
    else {
        TIXMLASSERT( sizeof( XMLText ) == _textPool.ItemSize() );
        returnNode = new (_textPool.Alloc()) XMLText( this );
        returnNode->_memPool = &_textPool;
        p = start;	// Back it up, all the text counts.
    }

    TIXMLASSERT( returnNode );
    TIXMLASSERT( p );
    *node = returnNode;
    return p;
}